

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::__fastunpack8_8(uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint32_t *out_local;
  uint32_t *in_local;
  
  *out = *in & 0xff;
  out[1] = *in >> 8 & 0xff;
  out[2] = *in >> 0x10 & 0xff;
  out[3] = *in >> 0x18;
  puVar1 = in + 1;
  out[4] = *puVar1 & 0xff;
  out[5] = *puVar1 >> 8 & 0xff;
  out[6] = *puVar1 >> 0x10 & 0xff;
  out[7] = *puVar1 >> 0x18;
  return in + 2;
}

Assistant:

const uint32_t *__fastunpack8_8(const uint32_t *__restrict__ in,
                                uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 8);
  out++;
  *out = ((*in) >> 8) % (1U << 8);
  out++;
  *out = ((*in) >> 16) % (1U << 8);
  out++;
  *out = ((*in) >> 24);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 8);
  out++;
  *out = ((*in) >> 8) % (1U << 8);
  out++;
  *out = ((*in) >> 16) % (1U << 8);
  out++;
  *out = ((*in) >> 24);
  ++in;
  out++;

  return in;
}